

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> * __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::
ConvertToNonSharedSimpleDictionaryType
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance)

{
  int *piVar1;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *pSVar2;
  
  if ((this->field_0x28 & 2) == 0) {
    pSVar2 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
             ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>,Js::JavascriptString*>
                       ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>
                         *)this,instance);
  }
  else {
    pSVar2 = &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
              ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::JavascriptString*,true>
                        ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>
                          *)this,instance)->
              super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>;
  }
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->
            convertSimpleSharedDictionaryToNonSharedCount;
  *piVar1 = *piVar1 + 1;
  return pSVar2;
}

Assistant:

SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToNonSharedSimpleDictionaryType(DynamicObject* instance)
    {
        // Although an unordered type handler is never actually shared, it can be flagged as shared by type snapshot enumeration
        // to freeze the initial type handler before enumeration commences
        SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>* newTypeHandler =
            isUnordered
                ? ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>(instance)
                : ConvertToTypeHandler<SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>, TMapKey>(instance);

#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertSimpleSharedDictionaryToNonSharedCount++;
#endif
        return newTypeHandler;
    }